

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int64_t client_seek_proxy(archive_read_filter *self,int64_t offset,int whence)

{
  int whence_local;
  int64_t offset_local;
  archive_read_filter *self_local;
  
  if ((self->archive->client).seeker == (archive_seek_callback *)0x0) {
    self_local = (archive_read_filter *)0xffffffffffffffe7;
  }
  else {
    self_local = (archive_read_filter *)
                 (*(self->archive->client).seeker)(&self->archive->archive,self->data,offset,whence)
    ;
  }
  return (int64_t)self_local;
}

Assistant:

static int64_t
client_seek_proxy(struct archive_read_filter *self, int64_t offset, int whence)
{
	/* DO NOT use the skipper here!  If we transparently handled
	 * forward seek here by using the skipper, that will break
	 * other libarchive code that assumes a successful forward
	 * seek means it can also seek backwards.
	 */
	if (self->archive->client.seeker == NULL)
		return (ARCHIVE_FAILED);
	return (self->archive->client.seeker)(&self->archive->archive,
	    self->data, offset, whence);
}